

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

ErrorData * __thiscall
duckdb::Binding::ColumnNotFoundError
          (ErrorData *__return_storage_ptr__,Binding *this,string *column_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58 [32];
  string local_38;
  
  ::std::__cxx11::string::string
            (local_58,"Values list \"%s\" does not have a column named \"%s\"",&local_99);
  GetAlias_abi_cxx11_(&local_78,this);
  ::std::__cxx11::string::string((string *)&local_98,(string *)column_name);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_38,(StringUtil *)local_58,&local_78,&local_98,in_R8);
  ErrorData::ErrorData(__return_storage_ptr__,BINDER,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

ErrorData Binding::ColumnNotFoundError(const string &column_name) const {
	return ErrorData(ExceptionType::BINDER, StringUtil::Format("Values list \"%s\" does not have a column named \"%s\"",
	                                                           GetAlias(), column_name));
}